

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

BOOL __thiscall
Js::SmallSpanSequence::GetMatchingStatementFromBytecode
          (SmallSpanSequence *this,int bytecode,SmallSpanSequenceIter *iter,StatementData *data)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  ulong in_RAX;
  GrowingUint32HeapArray *pGVar4;
  undefined4 *puVar5;
  uint index;
  undefined8 uStack_38;
  int countOfMissed;
  
  pGVar4 = this->pStatementBuffer;
  if ((pGVar4 != (GrowingUint32HeapArray *)0x0) && (-1 < bytecode && pGVar4->count != 0)) {
    if ((bytecode < iter->accumulatedBytecodeBegin) ||
       (index = iter->accumulatedIndex, (int)index < 1 || pGVar4->count <= index)) {
      iter->accumulatedIndex = 0;
      iter->accumulatedSourceBegin = this->baseValue;
      iter->accumulatedBytecodeBegin = 0;
      iter->indexOfActualOffset = 0;
      index = 0;
    }
    uStack_38 = in_RAX;
    do {
      if (pGVar4->count <= index) break;
      uStack_38 = uStack_38 & 0xffffffff;
      GetRangeAt(this,index,iter,(int *)((long)&uStack_38 + 4),data);
      iVar1 = data->bytecodeBegin;
      if (bytecode <= iVar1) {
        if (bytecode < iVar1) {
          iVar1 = iter->accumulatedBytecodeBegin;
          data->sourceBegin = iter->accumulatedSourceBegin;
          data->bytecodeBegin = iVar1;
        }
        return 1;
      }
      iter->accumulatedSourceBegin = data->sourceBegin;
      iter->accumulatedBytecodeBegin = iVar1;
      index = iter->accumulatedIndex + 1;
      iter->accumulatedIndex = index;
      if (uStack_38._4_4_ != 0) {
        iter->indexOfActualOffset = iter->indexOfActualOffset + uStack_38._4_4_;
      }
      pGVar4 = this->pStatementBuffer;
    } while (pGVar4 != (GrowingUint32HeapArray *)0x0);
    if (index != 0xffffffff) {
      if (data->bytecodeBegin < bytecode) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x15b2,"(data.bytecodeBegin < bytecode)",
                                  "data.bytecodeBegin < bytecode");
      if (bVar3) {
        *puVar5 = 0;
        return 1;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  iter->accumulatedIndex = -1;
  return 0;
}

Assistant:

BOOL SmallSpanSequence::GetMatchingStatementFromBytecode(int bytecode, SmallSpanSequenceIter &iter, StatementData & data)
    {
        if (Count() > 0 && bytecode >= 0)
        {
            // Support only in forward direction
            if (bytecode < iter.accumulatedBytecodeBegin
                || iter.accumulatedIndex <= 0 || (uint32)iter.accumulatedIndex >= Count())
            {
                // re-initialize the accumulators
                Reset(iter);
            }

            while ((uint32)iter.accumulatedIndex < Count())
            {
                int countOfMissed = 0;
                if (!GetRangeAt(iter.accumulatedIndex, iter, &countOfMissed, data))
                {
                    Assert(FALSE);
                    break;
                }

                if (data.bytecodeBegin >= bytecode)
                {
                    if (data.bytecodeBegin > bytecode)
                    {
                        // Not exactly at the current bytecode, so it falls in between previous statement.
                        data.sourceBegin = iter.accumulatedSourceBegin;
                        data.bytecodeBegin = iter.accumulatedBytecodeBegin;
                    }

                    return TRUE;
                }

                // Look for the next
                iter.accumulatedSourceBegin = data.sourceBegin;
                iter.accumulatedBytecodeBegin = data.bytecodeBegin;
                iter.accumulatedIndex++;

                if (countOfMissed)
                {
                    iter.indexOfActualOffset += countOfMissed;
                }
            }

            if (iter.accumulatedIndex != -1)
            {
                // Give the last one.
                Assert(data.bytecodeBegin < bytecode);
                return TRUE;
            }
        }

        // Failed to give the correct one, init to default
        iter.accumulatedIndex = -1;
        return FALSE;
    }